

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfd.h
# Opt level: O2

bool __thiscall pfd::internal::executor::ready(executor *this,int timeout)

{
  __pid_t _Var1;
  ssize_t sVar2;
  int *piVar3;
  int status;
  duration<long,_std::ratio<1L,_1000L>_> local_2038 [2];
  undefined1 local_2028 [16];
  char buf [8192];
  
  if (this->m_running != true) {
    return true;
  }
  sVar2 = read(this->m_fd,buf,0x2000);
  if (sVar2 < 1) {
    _Var1 = waitpid(this->m_pid,&status,1);
    if ((_Var1 == this->m_pid) || ((_Var1 < 0 && (piVar3 = __errno_location(), *piVar3 == 10)))) {
      close(this->m_fd);
      this->m_exit_code = (uint)status._1_1_;
      this->m_running = false;
      return true;
    }
    local_2038[0].__r = (rep)timeout;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(local_2038);
  }
  else {
    local_2038[0].__r = (rep)local_2028;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2038,buf,buf + sVar2);
    std::__cxx11::string::append((string *)&this->m_stdout);
    std::__cxx11::string::~string((string *)local_2038);
  }
  return false;
}

Assistant:

inline bool internal::executor::ready(int timeout /* = default_wait_timeout */)
{
    if (!m_running)
        return true;

#if _WIN32
    if (m_future.valid())
    {
        auto status = m_future.wait_for(std::chrono::milliseconds(timeout));
        if (status != std::future_status::ready)
        {
            // On Windows, we need to run the message pump. If the async
            // thread uses a Windows API dialog, it may be attached to the
            // main thread and waiting for messages that only we can dispatch.
            MSG msg;
            while (PeekMessage(&msg, nullptr, 0, 0, PM_REMOVE))
            {
                TranslateMessage(&msg);
                DispatchMessage(&msg);
            }
            return false;
        }

        m_stdout = m_future.get();
    }
#elif __EMSCRIPTEN__ || __NX__
    // FIXME: do something
    (void)timeout;
#else
    char buf[BUFSIZ];
    ssize_t received = read(m_fd, buf, BUFSIZ); // Flawfinder: ignore
    if (received > 0)
    {
        m_stdout += std::string(buf, received);
        return false;
    }

    // Reap child process if it is dead. It is possible that the system has already reaped it
    // (this happens when the calling application handles or ignores SIG_CHLD) and results in
    // waitpid() failing with ECHILD. Otherwise we assume the child is running and we sleep for
    // a little while.
    int status;
    pid_t child = waitpid(m_pid, &status, WNOHANG);
    if (child != m_pid && (child >= 0 || errno != ECHILD))
    {
        // FIXME: this happens almost always at first iteration
        std::this_thread::sleep_for(std::chrono::milliseconds(timeout));
        return false;
    }

    close(m_fd);
    m_exit_code = WEXITSTATUS(status);
#endif

    m_running = false;
    return true;
}